

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::CreateParallelTestCostList(cmCTestMultiProcessHandler *this)

{
  TestMap *this_00;
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pbVar3;
  iterator iVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  mapped_type *ppcVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  long lVar10;
  int *__buffer;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr *pp_Var13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  vector<int,std::allocator<int>> *this_02;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar15;
  pair<int_*,_long> pVar16;
  TestList sortedCopy;
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  priorityStack;
  TestSet alreadySortedTests;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_d0;
  _Base_ptr local_c8;
  _Base_ptr p_Stack_c0;
  _Base_ptr local_b8;
  size_t sStack_b0;
  vector<int,std::allocator<int>> *local_a0;
  _Rb_tree_node_base *local_98;
  _Iter_comp_iter<TestComparator> local_90;
  _Rb_tree_node_base local_88;
  cmCTestMultiProcessHandler *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._0_8_ = &local_88;
  local_88._M_left = (_Base_ptr)0x0;
  p_Stack_c0 = (_Base_ptr)&_Stack_d0;
  local_c8 = (_Base_ptr)0x0;
  local_d8._M_current = (int *)0x0;
  _Stack_d0._M_current = (int *)0x0;
  sStack_b0 = 0;
  local_b8 = p_Stack_c0;
  local_88._M_parent = (_Base_ptr)local_88._0_8_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  _M_insert<cmCTestMultiProcessHandler::TestSet>
            ((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              *)local_88._0_8_,(iterator)local_88._0_8_,(TestSet *)&local_d8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_d8);
  p_Var7 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98 = &(this->Tests).
              super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_98) {
    pp_Var13 = &(local_88._M_parent)->_M_left;
    local_a0 = (vector<int,std::allocator<int>> *)&this->Properties;
    local_88._M_right = (_Base_ptr)&this->SortedTests;
    do {
      pbVar2 = (this->LastTestsFailed).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->LastTestsFailed).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      p_Var9 = p_Var7 + 1;
      ppcVar5 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[]((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                              *)local_a0,(key_type *)p_Var9);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (pbVar2,pbVar3,*ppcVar5);
      this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)pp_Var13
      ;
      if (_Var6._M_current !=
          (this->LastTestsFailed).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar4._M_current =
             (this->SortedTests).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar4._M_current ==
            (this->SortedTests).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_88._M_right,iVar4,(int *)p_Var9);
          this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    &local_60;
        }
        else {
          *iVar4._M_current = p_Var9->_M_color;
          (this->SortedTests).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               iVar4._M_current + 1;
          this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    &local_60;
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(this_01,(int *)p_Var9);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_98);
  }
  if (local_88._M_parent[1]._M_right != (_Base_ptr)0x0) {
    this_00 = &this->Tests;
    local_68 = this;
    do {
      p_Var7 = local_88._M_parent;
      local_c8 = (_Base_ptr)0x0;
      local_d8._M_current = (int *)0x0;
      _Stack_d0._M_current = (int *)0x0;
      p_Stack_c0 = (_Base_ptr)&_Stack_d0;
      sStack_b0 = 0;
      local_b8 = p_Stack_c0;
      std::__cxx11::
      list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
      ::_M_insert<cmCTestMultiProcessHandler::TestSet>
                ((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                  *)&local_88,(iterator)&local_88,(TestSet *)&local_d8);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &local_d8);
      p_Var11 = local_88._M_parent;
      p_Var9 = p_Var7[1]._M_parent;
      if (p_Var9 != (_Rb_tree_node_base *)&p_Var7->_M_right) {
        pp_Var13 = &(local_88._M_parent)->_M_left;
        do {
          pmVar8 = std::
                   map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                   ::operator[](&this_00->
                                 super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                                ,(key_type *)(p_Var9 + 1));
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     pp_Var13,(pmVar8->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t.
                              _M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<int>)
                     &(pmVar8->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                      super__Rb_tree_header);
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while (p_Var9 != (_Rb_tree_node_base *)&p_Var7->_M_right);
      }
      this = local_68;
      p_Var9 = p_Var11[1]._M_parent;
      pp_Var13 = &p_Var11->_M_right;
      if (p_Var9 != (_Rb_tree_node_base *)pp_Var13) {
        do {
          pVar15 = std::
                   _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                   equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                *)&p_Var7->_M_left,(key_type *)(p_Var9 + 1));
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)&p_Var7->_M_left,(_Base_ptr)pVar15.first._M_node,
                       (_Base_ptr)pVar15.second._M_node);
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while (p_Var9 != (_Rb_tree_node_base *)pp_Var13);
      }
    } while (local_88._M_parent[1]._M_right != (_Base_ptr)0x0);
  }
  p_Var7 = &local_88;
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  _M_erase((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
            *)p_Var7,(iterator)local_88._M_parent);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if (p_Var7 != (_Base_ptr)local_88._0_8_) {
    this_02 = (vector<int,std::allocator<int>> *)&this->SortedTests;
    local_a0 = this_02;
    do {
      local_d8._M_current = (int *)0x0;
      _Stack_d0._M_current = (int *)0x0;
      local_c8 = (_Base_ptr)0x0;
      local_98 = p_Var7;
      std::vector<int,std::allocator<int>>::_M_range_insert<std::_Rb_tree_const_iterator<int>>
                ((vector<int,std::allocator<int>> *)&local_d8,0,p_Var7->_M_parent[1]._M_parent,
                 &p_Var7->_M_parent->_M_right);
      __last._M_current = _Stack_d0._M_current;
      _Var14._M_current = local_d8._M_current;
      if (local_d8._M_current != _Stack_d0._M_current) {
        lVar10 = (long)_Stack_d0._M_current - (long)local_d8._M_current >> 2;
        pVar16 = std::get_temporary_buffer<int>((lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
        lVar10 = pVar16.second;
        __buffer = pVar16.first;
        local_90._M_comp.Handler = (TestComparator)(TestComparator)this;
        if (__buffer == (int *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                    (_Var14,__last,&local_90);
          lVar10 = 0;
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                    (_Var14,__last,__buffer,lVar10,&local_90);
        }
        operator_delete(__buffer,lVar10 << 2);
        this_02 = local_a0;
      }
      p_Var9 = local_98;
      _Var14._M_current = local_d8._M_current;
      if (local_d8._M_current != _Stack_d0._M_current) {
        do {
          p_Var7 = &p_Var1->_M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              if (*_Var14._M_current <= (int)*(size_t *)(p_Var11 + 1)) {
                p_Var7 = p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < *_Var14._M_current];
            } while (p_Var11 != (_Base_ptr)0x0);
          }
          p_Var12 = p_Var1;
          if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
             (p_Var12 = (_Rb_tree_header *)p_Var7,
             *_Var14._M_current < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
            p_Var12 = p_Var1;
          }
          if (p_Var12 == p_Var1) {
            iVar4._M_current =
                 (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
            if (iVar4._M_current ==
                (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_02,iVar4,_Var14._M_current);
            }
            else {
              *iVar4._M_current = *_Var14._M_current;
              (this->SortedTests).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = iVar4._M_current + 1;
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_60,_Var14._M_current);
          }
          _Var14._M_current = _Var14._M_current + 1;
        } while (_Var14._M_current != _Stack_d0._M_current);
      }
      if (local_d8._M_current != (int *)0x0) {
        operator_delete(local_d8._M_current,(long)local_c8 - (long)local_d8._M_current);
      }
      p_Var7 = p_Var9->_M_parent;
    } while (p_Var7 != (_Base_ptr)local_88._0_8_);
  }
  std::__cxx11::
  _List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  ::_M_clear((_List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              *)&local_88);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateParallelTestCostList()
{
  TestSet alreadySortedTests;

  std::list<TestSet> priorityStack;
  priorityStack.push_back(TestSet());
  TestSet& topLevel = priorityStack.back();

  // In parallel test runs add previously failed tests to the front
  // of the cost list and queue other tests for further sorting
  for (TestMap::const_iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    if (std::find(this->LastTestsFailed.begin(), this->LastTestsFailed.end(),
                  this->Properties[i->first]->Name) !=
        this->LastTestsFailed.end()) {
      // If the test failed last time, it should be run first.
      this->SortedTests.push_back(i->first);
      alreadySortedTests.insert(i->first);
    } else {
      topLevel.insert(i->first);
    }
  }

  // In parallel test runs repeatedly move dependencies of the tests on
  // the current dependency level to the next level until no
  // further dependencies exist.
  while (!priorityStack.back().empty()) {
    TestSet& previousSet = priorityStack.back();
    priorityStack.push_back(TestSet());
    TestSet& currentSet = priorityStack.back();

    for (TestSet::const_iterator i = previousSet.begin();
         i != previousSet.end(); ++i) {
      TestSet const& dependencies = this->Tests[*i];
      currentSet.insert(dependencies.begin(), dependencies.end());
    }

    for (TestSet::const_iterator i = currentSet.begin(); i != currentSet.end();
         ++i) {
      previousSet.erase(*i);
    }
  }

  // Remove the empty dependency level
  priorityStack.pop_back();

  // Reverse iterate over the different dependency levels (deepest first).
  // Sort tests within each level by COST and append them to the cost list.
  for (std::list<TestSet>::reverse_iterator i = priorityStack.rbegin();
       i != priorityStack.rend(); ++i) {
    TestSet const& currentSet = *i;
    TestComparator comp(this);

    TestList sortedCopy;

    sortedCopy.insert(sortedCopy.end(), currentSet.begin(), currentSet.end());

    std::stable_sort(sortedCopy.begin(), sortedCopy.end(), comp);

    for (TestList::const_iterator j = sortedCopy.begin();
         j != sortedCopy.end(); ++j) {
      if (alreadySortedTests.find(*j) == alreadySortedTests.end()) {
        this->SortedTests.push_back(*j);
        alreadySortedTests.insert(*j);
      }
    }
  }
}